

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::CodeHolder::copyFlattenedData
          (CodeHolder *this,void *dst,size_t dstSize,CopySectionFlags copyFlags)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong __n;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n_00;
  ulong uVar8;
  
  uVar1 = *(uint *)&this->field_0xf0;
  if ((ulong)uVar1 == 0) {
    uVar8 = 0;
  }
  else {
    lVar2 = *(long *)&this->_sectionsByOrder;
    lVar5 = 0;
    uVar8 = 0;
    do {
      lVar3 = *(long *)(lVar2 + lVar5);
      uVar6 = *(ulong *)(lVar3 + 0x10);
      uVar7 = dstSize - uVar6;
      if ((dstSize < uVar6) || (__n = *(ulong *)(lVar3 + 0x50), uVar7 < __n)) {
        return 2;
      }
      memcpy((void *)((long)dst + uVar6),*(void **)(lVar3 + 0x48),__n);
      if (((copyFlags & kPadSectionBuffer) == kNone) ||
         (uVar4 = *(ulong *)(lVar3 + 0x18), uVar4 <= __n)) {
        __n_00 = 0;
      }
      else {
        if (uVar4 < uVar7) {
          uVar7 = uVar4;
        }
        __n_00 = uVar7 - __n;
        memset((void *)((long)((long)dst + uVar6) + __n),0,__n_00);
      }
      uVar6 = __n + uVar6 + __n_00;
      if (uVar8 <= uVar6) {
        uVar8 = uVar6;
      }
      lVar5 = lVar5 + 8;
    } while ((ulong)uVar1 << 3 != lVar5);
  }
  if (((copyFlags & kPadTargetBuffer) != kNone) && (uVar8 <= dstSize && dstSize - uVar8 != 0)) {
    memset((void *)((long)dst + uVar8),0,dstSize - uVar8);
  }
  return 0;
}

Assistant:

Error CodeHolder::copyFlattenedData(void* dst, size_t dstSize, CopySectionFlags copyFlags) noexcept {
  size_t end = 0;
  for (Section* section : _sectionsByOrder) {
    if (section->offset() > dstSize)
      return DebugUtils::errored(kErrorInvalidArgument);

    size_t bufferSize = section->bufferSize();
    size_t offset = size_t(section->offset());

    if (ASMJIT_UNLIKELY(dstSize - offset < bufferSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    uint8_t* dstTarget = static_cast<uint8_t*>(dst) + offset;
    size_t paddingSize = 0;
    memcpy(dstTarget, section->data(), bufferSize);

    if (Support::test(copyFlags, CopySectionFlags::kPadSectionBuffer) && bufferSize < section->virtualSize()) {
      paddingSize = Support::min<size_t>(dstSize - offset, size_t(section->virtualSize())) - bufferSize;
      memset(dstTarget + bufferSize, 0, paddingSize);
    }

    end = Support::max(end, offset + bufferSize + paddingSize);
  }

  if (end < dstSize && Support::test(copyFlags, CopySectionFlags::kPadTargetBuffer)) {
    memset(static_cast<uint8_t*>(dst) + end, 0, dstSize - end);
  }

  return kErrorOk;
}